

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

Dependency * __thiscall
kj::Vector<capnp::_::RawBrandedSchema::Dependency>::add<>
          (Vector<capnp::_::RawBrandedSchema::Dependency> *this)

{
  Dependency *pDVar1;
  RemoveConst<capnp::_::RawBrandedSchema::Dependency> *pRVar2;
  
  pRVar2 = (this->builder).pos;
  if (pRVar2 == (this->builder).endPtr) {
    grow(this,0);
    pRVar2 = (this->builder).pos;
  }
  *(undefined8 *)pRVar2 = 0;
  pRVar2->schema = (RawBrandedSchema *)0x0;
  pDVar1 = (this->builder).pos;
  (this->builder).pos = pDVar1 + 1;
  return pDVar1;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }